

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O0

int Msat_SolverAddClause(Msat_Solver_t *p,Msat_IntVec_t *vLits)

{
  int iVar1;
  Msat_Clause_t *pMStack_20;
  int Value;
  Msat_Clause_t *pC;
  Msat_IntVec_t *vLits_local;
  Msat_Solver_t *p_local;
  
  pC = (Msat_Clause_t *)vLits;
  vLits_local = (Msat_IntVec_t *)p;
  iVar1 = Msat_ClauseCreate(p,vLits,0,&stack0xffffffffffffffe0);
  if (pMStack_20 != (Msat_Clause_t *)0x0) {
    Msat_ClauseVecPush(*(Msat_ClauseVec_t **)&vLits_local->nSize,pMStack_20);
  }
  return iVar1;
}

Assistant:

int  Msat_SolverAddClause( Msat_Solver_t * p, Msat_IntVec_t * vLits )
{
    Msat_Clause_t * pC; 
    int  Value;
    Value = Msat_ClauseCreate( p, vLits, 0, &pC );
    if ( pC != NULL )
        Msat_ClauseVecPush( p->vClauses, pC );
//    else if ( p->fProof )
//        Msat_ClauseCreateFake( p, vLits );
    return Value;
}